

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O2

bool LTOnlineChannel::IsRevocationError(string *err)

{
  long lVar1;
  long lVar2;
  long lVar3;
  string s;
  allocator<char> local_51;
  string local_50 [32];
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 == 0x18) break;
    std::__cxx11::string::string<std::allocator<char>>
              (local_50,*(char **)((long)&PTR_anon_var_dwarf_166a57_002bbaf8 + lVar2),&local_51);
    lVar3 = std::__cxx11::string::find((string *)err,(ulong)local_50);
    std::__cxx11::string::~string(local_50);
    lVar1 = lVar2 + 8;
  } while (lVar3 == -1);
  return lVar2 != 0x18;
}

Assistant:

bool LTOnlineChannel::IsRevocationError (const std::string& err)
{
    // we can check for the word "revocation", but in localized versions of
    // Windows this is translated! We have, so far, seen two different error codes.
    // So what we do is to look for all three things:
    for (const std::string s: ERR_CURL_REVOKE_MSG)
        if (err.find(s) != std::string::npos)
            return true;
    return false;
}